

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O2

bool __thiscall slang::ast::Type::isNumeric(Type *this)

{
  bool bVar1;
  
  bVar1 = isIntegral(this);
  if (bVar1) {
    return true;
  }
  bVar1 = isFloating(this);
  return bVar1;
}

Assistant:

bool isNumeric() const { return isIntegral() || isFloating(); }